

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateUnaryOp(ExpressionEvalContext *ctx,ExprUnaryOp *expression)

{
  byte bVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  ExpressionContext *pEVar5;
  TypeStruct *pTVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  ExprMemoryLiteral *expression_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TypeRef *type;
  undefined4 extraout_var_07;
  ExprBase *pEVar9;
  undefined4 extraout_var_08;
  char *msg;
  ExprMemoryLiteral *memory;
  ExprRationalLiteral *expr;
  ExprPointerLiteral *pEVar10;
  undefined4 uVar11;
  uint uVar12;
  double result;
  double local_30;
  
  uVar12 = (ctx->stackFrames).count;
  if ((uVar12 != 0) && ((ctx->stackFrames).data[uVar12 - 1]->targetYield != 0)) {
    pAVar2 = ctx->ctx->allocator;
    iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar8);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar9->typeID = 2;
    pEVar9->source = pSVar3;
    pEVar9->type = pTVar4;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240688;
    return pEVar9;
  }
  if (ctx->instructionsLimit <= ctx->instruction) {
    msg = "ERROR: instruction limit reached";
    goto LAB_0014afe8;
  }
  ctx->instruction = ctx->instruction + 1;
  expression_00 = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
  if (expression_00 == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  pTVar4 = (expression_00->super_ExprBase).type;
  pEVar5 = ctx->ctx;
  if (pTVar4 == pEVar5->typeBool) {
    uVar12 = (expression_00->super_ExprBase).typeID;
    if (uVar12 == 6) {
      if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) {
        iVar8 = (*pEVar5->allocator->_vptr_Allocator[2])(pEVar5->allocator,0x30);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_02,iVar8);
        pEVar10 = expression_00->ptr;
        pEVar9->typeID = 3;
        pTVar4 = (expression->super_ExprBase).type;
        pEVar9->source = (expression->super_ExprBase).source;
        pEVar9->type = pTVar4;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240490;
        pEVar9->field_0x29 = pEVar10 == (ExprPointerLiteral *)0x0;
        goto LAB_0014b0f0;
      }
    }
    else if ((uVar12 == 3) && (*(int *)&(expression->super_ExprBase).field_0x2c == 4)) {
      iVar8 = (*pEVar5->allocator->_vptr_Allocator[2])(pEVar5->allocator,0x30);
      pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
      bVar1 = (expression_00->super_ExprBase).field_0x29;
      pEVar9->typeID = 3;
      pTVar4 = (expression->super_ExprBase).type;
      pEVar9->source = (expression->super_ExprBase).source;
      pEVar9->type = pTVar4;
      pEVar9->next = (ExprBase *)0x0;
      pEVar9->listed = false;
      pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240490;
      pEVar9->field_0x29 = bVar1 ^ 1;
      goto LAB_0014b0f0;
    }
  }
  else {
    bVar7 = ExpressionContext::IsIntegerType(pEVar5,pTVar4);
    if (bVar7) {
      switch((expression_00->super_ExprBase).typeID) {
      case 3:
        pEVar10 = (ExprPointerLiteral *)(ulong)(byte)(expression_00->super_ExprBase).field_0x29;
        break;
      case 4:
        pEVar10 = (ExprPointerLiteral *)(long)(char)(expression_00->super_ExprBase).field_0x29;
        break;
      default:
        goto switchD_0014ae5f_caseD_5;
      case 6:
        pEVar10 = expression_00->ptr;
        break;
      case 7:
        pEVar10 = (ExprPointerLiteral *)(long)(double)expression_00->ptr;
      }
      switch(*(undefined4 *)&(expression->super_ExprBase).field_0x2c) {
      case 1:
        pAVar2 = ctx->ctx->allocator;
        iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_03,iVar8);
        break;
      case 2:
        pAVar2 = ctx->ctx->allocator;
        iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_06,iVar8);
        pEVar10 = (ExprPointerLiteral *)-(long)pEVar10;
        break;
      case 3:
        pAVar2 = ctx->ctx->allocator;
        iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_04,iVar8);
        pEVar10 = (ExprPointerLiteral *)~(ulong)pEVar10;
        break;
      case 4:
        pAVar2 = ctx->ctx->allocator;
        iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
        pEVar9 = (ExprBase *)CONCAT44(extraout_var_05,iVar8);
        pEVar9->typeID = 6;
        pTVar4 = (expression->super_ExprBase).type;
        pEVar9->source = (expression->super_ExprBase).source;
        pEVar9->type = pTVar4;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
        pEVar9[1]._vptr_ExprBase = (_func_int **)(ulong)(pEVar10 == (ExprPointerLiteral *)0x0);
        goto LAB_0014b0f0;
      default:
        __assert_fail("!\"unknown unary operation\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x57b,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)");
      }
      pEVar9->typeID = 6;
      pTVar4 = (expression->super_ExprBase).type;
      pEVar9->source = (expression->super_ExprBase).source;
      pEVar9->type = pTVar4;
      pEVar9->next = (ExprBase *)0x0;
      pEVar9->listed = false;
      pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240500;
      pEVar9[1]._vptr_ExprBase = (_func_int **)pEVar10;
LAB_0014b0f0:
      pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
      return pEVar9;
    }
    bVar7 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression_00->super_ExprBase).type);
    if (bVar7) {
      local_30 = 0.0;
      bVar7 = TryTakeDouble((ExprBase *)expression_00,&local_30);
      if (bVar7) {
        iVar8 = *(int *)&(expression->super_ExprBase).field_0x2c;
        if (iVar8 - 3U < 2) {
          return (ExprBase *)0x0;
        }
        if (iVar8 == 2) {
          pAVar2 = ctx->ctx->allocator;
          iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var_07,iVar8);
          uVar11 = SUB84(local_30,0);
          uVar12 = (uint)((ulong)local_30 >> 0x20) ^ 0x80000000;
        }
        else {
          if (iVar8 != 1) {
            __assert_fail("!\"unknown unary operation\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x58f,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)"
                         );
          }
          pAVar2 = ctx->ctx->allocator;
          iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x38);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var_01,iVar8);
          uVar11 = SUB84(local_30,0);
          uVar12 = (uint)((ulong)local_30 >> 0x20);
        }
        pEVar9->typeID = 7;
        pTVar4 = (expression->super_ExprBase).type;
        pEVar9->source = (expression->super_ExprBase).source;
        pEVar9->type = pTVar4;
        pEVar9->next = (ExprBase *)0x0;
        pEVar9->listed = false;
        pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240538;
        pEVar9[1]._vptr_ExprBase = (_func_int **)CONCAT44(uVar12,uVar11);
        pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
        return pEVar9;
      }
    }
    else {
      pTVar6 = (TypeStruct *)(expression_00->super_ExprBase).type;
      if ((pTVar6 == (TypeStruct *)0x0) || ((pTVar6->super_TypeBase).typeID != 0x12)) {
        pEVar5 = ctx->ctx;
        if (pTVar6 == pEVar5->typeAutoRef) {
          memory = (ExprMemoryLiteral *)0x0;
          if ((expression_00->super_ExprBase).typeID == 0xd) {
            memory = expression_00;
          }
          type = ExpressionContext::GetReferenceType(pEVar5,pEVar5->typeVoid);
          pEVar9 = CreateExtract(ctx,memory,4,&type->super_TypeBase);
          if (pEVar9 != (ExprBase *)0x0) {
            if (pEVar9->typeID == 9) {
              bVar7 = true;
            }
            else {
              if (pEVar9->typeID != 0xc) goto LAB_0014b14f;
              bVar7 = pEVar9[1]._vptr_ExprBase == (_func_int **)0x0;
            }
LAB_0014b1bd:
            pAVar2 = ctx->ctx->allocator;
            iVar8 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
            pEVar9 = (ExprBase *)CONCAT44(extraout_var_08,iVar8);
            pSVar3 = (expression->super_ExprBase).source;
            pTVar4 = ctx->ctx->typeBool;
            pEVar9->typeID = 3;
            pEVar9->source = pSVar3;
            pEVar9->type = pTVar4;
            pEVar9->next = (ExprBase *)0x0;
            pEVar9->listed = false;
            pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240490;
            pEVar9->field_0x29 = bVar7;
            goto LAB_0014b0f0;
          }
LAB_0014b14f:
          msg = "ERROR: failed to evaluate auto ref value";
          goto LAB_0014afe8;
        }
      }
      else {
        uVar12 = (expression_00->super_ExprBase).typeID;
        bVar7 = true;
        if (uVar12 != 9) {
          if (uVar12 != 0xc) {
            __assert_fail("!\"unknown type\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                          ,0x59c,"ExprBase *EvaluateUnaryOp(ExpressionEvalContext &, ExprUnaryOp *)"
                         );
          }
          bVar7 = expression_00->ptr == (ExprPointerLiteral *)0x0;
        }
        if (*(int *)&(expression->super_ExprBase).field_0x2c == 4) goto LAB_0014b1bd;
      }
    }
  }
switchD_0014ae5f_caseD_5:
  msg = "ERROR: failed to eval unary op";
LAB_0014afe8:
  Report(ctx,msg);
  return (ExprBase *)0x0;
}

Assistant:

ExprBase* EvaluateUnaryOp(ExpressionEvalContext &ctx, ExprUnaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	if(value->type == ctx.ctx.typeBool)
	{
		if(ExprBoolLiteral *expr = getType<ExprBoolLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
		else if(ExprIntegerLiteral *expr = getType<ExprIntegerLiteral>(value))
		{
			if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
				return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, expression->type, !expr->value));
		}
	}
	else if(ctx.ctx.IsIntegerType(value->type))
	{
		long long result = 0;

		if(TryTakeLong(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, ~result));
			case SYN_UNARY_OP_LOGICAL_NOT:
				return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, !result));
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(ctx.ctx.IsFloatingPointType(value->type))
	{
		double result = 0.0;

		if(TryTakeDouble(value, result))
		{
			switch(expression->op)
			{
			case SYN_UNARY_OP_PLUS:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, result));
			case SYN_UNARY_OP_NEGATE:
				return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, expression->type, -result));
			case SYN_UNARY_OP_BIT_NOT:
			case SYN_UNARY_OP_LOGICAL_NOT:
				return NULL;
			default:
				assert(!"unknown unary operation");
			}
		}
	}
	else if(isType<TypeRef>(value->type))
	{
		void *lPtr = NULL;

		if(isType<ExprNullptrLiteral>(value))
			lPtr = NULL;
		else if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			lPtr = tmp->ptr;
		else
			assert(!"unknown type");

		if(expression->op == SYN_UNARY_OP_LOGICAL_NOT)
			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));
	}
	else if(value->type == ctx.ctx.typeAutoRef)
	{
		ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

		void *lPtr = 0;
		if(!TryTakePointer(CreateExtract(ctx, memLiteral, 4, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid)), lPtr))
			return Report(ctx, "ERROR: failed to evaluate auto ref value");

		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !lPtr));

	}

	return Report(ctx, "ERROR: failed to eval unary op");
}